

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O0

void __thiscall
SGParser::Generator::NFA::CombineNFAs
          (NFA *this,
          vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_> *NFAList)

{
  bool bVar1;
  NFANode *modify;
  reference ppNVar2;
  iterator __first;
  iterator __last;
  __normal_iterator<SGParser::Generator::NFANode_**,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
  local_50;
  const_iterator local_48;
  NFA *local_40;
  NFA *nfa;
  const_iterator __end2;
  const_iterator __begin2;
  vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_> *__range2;
  NFANode *pnewStartState;
  vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_> *NFAList_local;
  NFA *this_local;
  
  modify = NewState(this,0);
  if (this->pStartState != (NFANode *)0x0) {
    AddLink(this,modify,0,this->pStartState);
  }
  this->pStartState = modify;
  __end2 = std::vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>::
           begin(NFAList);
  nfa = (NFA *)std::vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
               ::end(NFAList);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<SGParser::Generator::NFA_*const_*,_std::vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>_>
                                *)&nfa);
    if (!bVar1) break;
    ppNVar2 = __gnu_cxx::
              __normal_iterator<SGParser::Generator::NFA_*const_*,_std::vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>_>
              ::operator*(&__end2);
    local_40 = *ppNVar2;
    AddLink(this,this->pStartState,0,local_40->pStartState);
    local_50._M_current =
         (NFANode **)
         std::
         vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>::
         end(&this->FinalState);
    __gnu_cxx::
    __normal_iterator<SGParser::Generator::NFANode*const*,std::vector<SGParser::Generator::NFANode*,std::allocator<SGParser::Generator::NFANode*>>>
    ::__normal_iterator<SGParser::Generator::NFANode**>
              ((__normal_iterator<SGParser::Generator::NFANode*const*,std::vector<SGParser::Generator::NFANode*,std::allocator<SGParser::Generator::NFANode*>>>
                *)&local_48,&local_50);
    __first = std::
              vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
              ::begin(&local_40->FinalState);
    __last = std::
             vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
             ::end(&local_40->FinalState);
    std::vector<SGParser::Generator::NFANode*,std::allocator<SGParser::Generator::NFANode*>>::
    insert<__gnu_cxx::__normal_iterator<SGParser::Generator::NFANode**,std::vector<SGParser::Generator::NFANode*,std::allocator<SGParser::Generator::NFANode*>>>,void>
              ((vector<SGParser::Generator::NFANode*,std::allocator<SGParser::Generator::NFANode*>>
                *)&this->FinalState,local_48,
               (__normal_iterator<SGParser::Generator::NFANode_**,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
                )__first._M_current,
               (__normal_iterator<SGParser::Generator::NFANode_**,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
                )__last._M_current);
    local_40->pStartState = (NFANode *)0x0;
    std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>::
    clear(&local_40->FinalState);
    __gnu_cxx::
    __normal_iterator<SGParser::Generator::NFA_*const_*,_std::vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void NFA::CombineNFAs(const std::vector<NFA*>& NFAList) {
    // Create a new start state
    const auto pnewStartState = NewState(0u);

    // If this NFA is valid than treat it as though it was one of the others
    if (pStartState)
        AddLink(pnewStartState, NFANode::Epsilon, pStartState);

    pStartState = pnewStartState;

    // Connect the start state to the start state of each of the NFAs in the list
    // Also add each NFAs final states to our final state list
    for (const auto nfa : NFAList) {
        // Should probably check to see if any of the NFA's are equal to this one

        AddLink(pStartState, NFANode::Epsilon, nfa->pStartState);
        FinalState.insert(FinalState.end(), nfa->FinalState.begin(), nfa->FinalState.end());

        // Clear the NFA
        nfa->pStartState = nullptr;
        nfa->FinalState.clear();
    }
}